

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O0

BrandTypeIterator * __thiscall
wasm::anon_unknown_0::BrandTypeIterator::operator++(BrandTypeIterator *this)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  int local_1c;
  Index i;
  BrandTypeIterator *this_local;
  
  sVar2 = std::
          vector<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
          ::size(&this->fields);
  local_1c = (int)sVar2;
  while( true ) {
    if (local_1c == 0) {
      if ((this->useArray & 1U) == 0) {
        std::
        vector<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
        ::emplace_back<>(&this->fields);
        sVar2 = std::
                vector<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                ::size(&this->fields);
        this->useArray = sVar2 == 1;
      }
      else {
        this->useArray = false;
      }
      return this;
    }
    this_00 = std::
              vector<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
              ::operator[](&this->fields,(ulong)(local_1c - 1));
    bVar1 = FieldInfo::advance(this_00);
    if (bVar1) break;
    local_1c = local_1c + -1;
  }
  return this;
}

Assistant:

BrandTypeIterator& operator++() {
    for (Index i = fields.size(); i > 0; --i) {
      if (fields[i - 1].advance()) {
        return *this;
      }
    }
    if (useArray) {
      useArray = false;
      return *this;
    }
    fields.emplace_back();
    useArray = fields.size() == 1;
    return *this;
  }